

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O3

void __thiscall
OpenMD::CubicSpline::getValueAndDerivativeAt(CubicSpline *this,RealType *t,RealType *v,RealType *dv)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  
  if (this->generated == false) {
    generate(this);
  }
  if (this->isUniform == true) {
    dVar10 = *t;
    pdVar4 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = this->n;
    iVar5 = uVar6 - 1;
    iVar8 = (int)((dVar10 - *pdVar4) * this->dx);
  }
  else {
    uVar6 = this->n;
    iVar5 = uVar6 - 1;
    dVar10 = *t;
    pdVar4 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = iVar5;
    if (0 < (int)uVar6) {
      uVar9 = 0;
      do {
        if (dVar10 < pdVar4[uVar9]) {
          iVar8 = (int)uVar9 + -1;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
  }
  if (iVar8 < (int)uVar6) {
    iVar5 = iVar8;
  }
  iVar7 = 0;
  if (-1 < iVar8) {
    iVar7 = iVar5;
  }
  this->j = iVar7;
  dVar10 = dVar10 - pdVar4[iVar7];
  this->dt = dVar10;
  pdVar1 = (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *v = ((pdVar2[iVar7] * dVar10 + pdVar1[iVar7]) * dVar10 + pdVar3[iVar7]) * dVar10 +
       (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[iVar7];
  dVar10 = pdVar1[iVar7];
  *dv = (dVar10 + dVar10 + this->dt * 3.0 * pdVar2[iVar7]) * this->dt + pdVar3[iVar7];
  return;
}

Assistant:

void CubicSpline::getValueAndDerivativeAt(const RealType& t, RealType& v,
                                            RealType& dv) {
    // Evaluate the spline and first derivative at t using coefficients
    //
    // Input parameters
    //   t = point where spline is to be evaluated.

    if (!generated) generate();

    //  Find the interval ( x[j], x[j+1] ) that contains or is nearest
    //  to t.

    if (isUniform) {
      j = int((t - x_[0]) * dx);

    } else {
      j = n - 1;

      for (int i = 0; i < n; i++) {
        if (t < x_[i]) {
          j = i - 1;
          break;
        }
      }
    }

    j = std::clamp(j, 0, n - 1);

    //  Evaluate the cubic polynomial.

    dt = t - x_[j];

    v  = y_[j] + dt * (b[j] + dt * (c[j] + dt * d[j]));
    dv = b[j] + dt * (2.0 * c[j] + 3.0 * dt * d[j]);
  }